

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetTargetPropertyCommand.cxx
# Opt level: O0

bool __thiscall
cmGetTargetPropertyCommand::InitialPass
          (cmGetTargetPropertyCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  MessageType t;
  bool bVar2;
  PolicyStatus PVar3;
  size_type sVar4;
  const_reference pvVar5;
  string *psVar6;
  cmTarget *pcVar7;
  ulong uVar8;
  ostream *poVar9;
  char *pcVar10;
  PolicyID id;
  bool bVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  int local_29c;
  string local_298;
  string local_278;
  MessageType local_254;
  undefined1 local_250 [4];
  MessageType messageType;
  ostringstream e;
  char *pcStack_d0;
  bool issueMessage;
  char *prop_cstr;
  cmTarget *target_1;
  cmTarget *tgt;
  cmTarget *target;
  string local_a8 [7];
  bool prop_exists;
  string prop;
  string *targetName;
  string var;
  allocator local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmGetTargetPropertyCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar4 != 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
    goto LAB_00606826;
  }
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)param_2_local,0);
  std::__cxx11::string::string((string *)&targetName,(string *)pvVar5);
  prop.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)param_2_local,1);
  std::__cxx11::string::string(local_a8);
  bVar11 = false;
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)param_2_local,2);
  bVar2 = std::operator==(pvVar5,"ALIASED_TARGET");
  if (bVar2) {
    bVar2 = cmMakefile::IsAlias((this->super_cmCommand).Makefile,(string *)prop.field_2._8_8_);
    if (bVar2) {
      pcVar7 = cmMakefile::FindTargetToUse
                         ((this->super_cmCommand).Makefile,(string *)prop.field_2._8_8_,false);
      bVar11 = pcVar7 != (cmTarget *)0x0;
      if (bVar11) {
        psVar6 = cmTarget::GetName_abi_cxx11_(pcVar7);
        std::__cxx11::string::operator=(local_a8,(string *)psVar6);
      }
    }
LAB_00606727:
    if (bVar11) {
      pcVar1 = (this->super_cmCommand).Makefile;
      pcVar10 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddDefinition(pcVar1,(string *)&targetName,pcVar10);
      this_local._7_1_ = 1;
      local_29c = 1;
    }
    else {
      pcVar1 = (this->super_cmCommand).Makefile;
      std::operator+(&local_2c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &targetName,"-NOTFOUND");
      pcVar10 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddDefinition(pcVar1,(string *)&targetName,pcVar10);
      std::__cxx11::string::~string((string *)&local_2c0);
      this_local._7_1_ = 1;
      local_29c = 1;
    }
  }
  else {
    pcVar7 = cmMakefile::FindTargetToUse
                       ((this->super_cmCommand).Makefile,(string *)prop.field_2._8_8_,false);
    if (pcVar7 != (cmTarget *)0x0) {
      pcStack_d0 = (char *)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_2_local,2);
      uVar8 = std::__cxx11::string::empty();
      if ((uVar8 & 1) == 0) {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_2_local,2);
        pcStack_d0 = cmTarget::GetProperty(pcVar7,pvVar5,(this->super_cmCommand).Makefile);
      }
      bVar11 = pcStack_d0 != (char *)0x0;
      if (bVar11) {
        std::__cxx11::string::operator=(local_a8,pcStack_d0);
      }
      goto LAB_00606727;
    }
    bVar2 = false;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_250);
    local_254 = AUTHOR_WARNING;
    PVar3 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0045);
    if (PVar3 != OLD) {
      if (PVar3 == WARN) {
        bVar2 = true;
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_278,(cmPolicies *)0x2d,id);
        poVar9 = std::operator<<((ostream *)local_250,(string *)&local_278);
        std::operator<<(poVar9,"\n");
        std::__cxx11::string::~string((string *)&local_278);
      }
      else if (PVar3 - NEW < 3) {
        bVar2 = true;
        local_254 = FATAL_ERROR;
      }
    }
    if (bVar2) {
      poVar9 = std::operator<<((ostream *)local_250,
                               "get_target_property() called with non-existent target \"");
      poVar9 = std::operator<<(poVar9,(string *)prop.field_2._8_8_);
      std::operator<<(poVar9,"\".");
      t = local_254;
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar1,t,&local_298);
      std::__cxx11::string::~string((string *)&local_298);
      if (local_254 != FATAL_ERROR) goto LAB_006066ec;
      this_local._7_1_ = 0;
      local_29c = 1;
    }
    else {
LAB_006066ec:
      local_29c = 0;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_250);
    if (local_29c == 0) goto LAB_00606727;
  }
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string((string *)&targetName);
LAB_00606826:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmGetTargetPropertyCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() != 3 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }
  std::string var = args[0];
  const std::string& targetName = args[1];
  std::string prop;
  bool prop_exists = false;

  if(args[2] == "ALIASED_TARGET")
    {
    if(this->Makefile->IsAlias(targetName))
      {
      if(cmTarget* target =
                          this->Makefile->FindTargetToUse(targetName))
        {
        prop = target->GetName();
        prop_exists = true;
        }
      }
    }
  else if(cmTarget* tgt = this->Makefile->FindTargetToUse(targetName))
    {
    cmTarget& target = *tgt;
    const char* prop_cstr = 0;
    if (!args[2].empty())
      {
      prop_cstr = target.GetProperty(args[2], this->Makefile);
      }
    if(prop_cstr)
      {
      prop = prop_cstr;
      prop_exists = true;
      }
    }
  else
    {
    bool issueMessage = false;
    std::ostringstream e;
    cmake::MessageType messageType = cmake::AUTHOR_WARNING;
    switch(this->Makefile->GetPolicyStatus(cmPolicies::CMP0045))
      {
      case cmPolicies::WARN:
        issueMessage = true;
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0045) << "\n";
      case cmPolicies::OLD:
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::NEW:
        issueMessage = true;
        messageType = cmake::FATAL_ERROR;
      }
    if (issueMessage)
      {
      e << "get_target_property() called with non-existent target \""
        << targetName <<  "\".";
      this->Makefile->IssueMessage(messageType, e.str());
      if (messageType == cmake::FATAL_ERROR)
        {
        return false;
        }
      }
    }
  if (prop_exists)
    {
    this->Makefile->AddDefinition(var, prop.c_str());
    return true;
    }
  this->Makefile->AddDefinition(var, (var+"-NOTFOUND").c_str());
  return true;
}